

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckFeatures.cpp
# Opt level: O2

bool __thiscall
GdlRenderer::PreCompileFeatures
          (GdlRenderer *this,GrcManager *pcman,GrcFont *param_2,uint32_t *pfxdFeatVersion)

{
  pointer ppGVar1;
  GdlFeatureDefn *this_00;
  string sta4;
  bool bVar2;
  iterator iVar3;
  ulong uVar4;
  ulong uVar5;
  uint nID;
  int local_1cc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vnIDs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160;
  string local_140;
  string local_120;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> setID;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> stnID;
  string local_70;
  string local_50;
  
  *pfxdFeatVersion = 0x10000;
  setID._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &setID._M_t._M_impl.super__Rb_tree_header._M_header;
  setID._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  setID._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  setID._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar5 = 0;
  local_1cc = 0;
  setID._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       setID._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    ppGVar1 = (this->m_vpfeat).
              super__Vector_base<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar4 = (long)(this->m_vpfeat).
                  super__Vector_base<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppGVar1 >> 3;
    if (uVar4 <= uVar5) break;
    this_00 = ppGVar1[uVar5];
    vnIDs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vnIDs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vnIDs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&vnIDs,&this_00->m_vnIDs);
    for (uVar4 = 0;
        uVar4 < (ulong)((long)vnIDs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)vnIDs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2); uVar4 = uVar4 + 1) {
      nID = vnIDs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4];
      iVar3 = std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::find(&setID._M_t,&nID);
      if ((_Rb_tree_header *)iVar3._M_node == &setID._M_t._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
        ::_M_insert_unique<unsigned_int_const&>
                  ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    *)&setID,&nID);
      }
      else {
        if (nID < 0x1000000) {
          std::__cxx11::to_string(&stnID,nID);
        }
        else {
          local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
          local_180.field_2._M_allocated_capacity._0_4_ =
               nID >> 0x18 | (nID & 0xff0000) >> 8 | (nID & 0xff00) << 8 | nID << 0x18;
          local_180._M_string_length = 4;
          local_180.field_2._M_local_buf[4] = '\0';
          std::operator+(&local_b0,'\'',&local_180);
          std::operator+(&stnID,&local_b0,'\'');
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_180);
        }
        std::__cxx11::string::string
                  ((string *)&local_50,"Duplicate feature ID: ",(allocator *)&local_b0);
        std::__cxx11::string::string((string *)&local_70,(string *)&stnID);
        GrcErrorList::AddError
                  (&g_errorList,0xc50,&(this_00->super_GdlDefn).super_GdlObject,&local_50,&local_70)
        ;
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&stnID);
      }
      if (0xffff < nID) {
        *pfxdFeatVersion = 0x20000;
      }
    }
    bVar2 = GdlFeatureDefn::ErrorCheck(this_00);
    if (bVar2) {
      GdlFeatureDefn::SortFeatIDs(this_00);
      GdlFeatureDefn::SortFeatSettings(this_00);
      GdlFeatureDefn::SetStdStyleFlag(this_00);
      GdlFeatureDefn::FillInBoolean(this_00,pcman->m_psymtbl);
      GdlFeatureDefn::ErrorCheckContd(this_00);
      GdlFeatureDefn::CalculateDefault(this_00);
      this_00->m_nInternalID = local_1cc;
      GdlFeatureDefn::RecordDebugInfo(this_00);
      local_1cc = local_1cc +
                  (int)((ulong)((long)vnIDs.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)vnIDs.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 2);
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&vnIDs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    uVar5 = uVar5 + 1;
  }
  if (0x40 < uVar4) {
    std::__cxx11::string::string((string *)&local_120,"Number of features (",(allocator *)&stnID);
    std::__cxx11::to_string
              (&local_140,
               (long)(this->m_vpfeat).
                     super__Vector_base<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(this->m_vpfeat).
                     super__Vector_base<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>._M_impl
                     .super__Vector_impl_data._M_start >> 3);
    std::__cxx11::string::string
              ((string *)&local_160,") exceeds maximum of ",(allocator *)&local_b0);
    std::__cxx11::to_string(&local_d0,0x40);
    sta4._M_string_length._0_4_ = nID;
    sta4._M_dataplus._M_p = (pointer)&local_d0;
    sta4._M_string_length._4_4_ = local_1cc;
    sta4.field_2._M_allocated_capacity =
         (size_type)
         vnIDs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    sta4.field_2._8_8_ =
         vnIDs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    GrcErrorList::AddError
              (&g_errorList,0xc51,(GdlObject *)0x0,&local_120,&local_140,&local_160,sta4);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_120);
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&setID._M_t);
  return true;
}

Assistant:

bool GdlRenderer::PreCompileFeatures(GrcManager * pcman, GrcFont * /*pfont*/, uint32_t * pfxdFeatVersion)
{
	*pfxdFeatVersion = 0x00010000;

	int nInternalID = 0;

	std::set<unsigned int> setID;

	for (size_t ipfeat = 0; ipfeat < m_vpfeat.size(); ipfeat++)
	{
		GdlFeatureDefn * pfeat = m_vpfeat[ipfeat];
		std::vector<unsigned int> vnIDs;
		pfeat->AltIDs(vnIDs);
		for (size_t iID = 0; iID < vnIDs.size(); iID++)
		{
			unsigned int nID = vnIDs[iID];
			if (setID.find(nID) != setID.end()) // is a member
			{
				auto stnID = nID > 0x00FFFFFF 
					? '\'' +std::string{char(nID >> 24), char(nID >> 16), char(nID >> 8), char(nID)} + '\''
					: std::to_string(nID);
				g_errorList.AddError(3152, pfeat, "Duplicate feature ID: ", stnID);
			}
			else
				setID.insert(nID);

			if (nID > 0x0000FFFF)
				*pfxdFeatVersion = 0x00020000;
		}

		if (pfeat->ErrorCheck())
		{
			pfeat->SortFeatIDs();
			pfeat->SortFeatSettings();
			pfeat->SetStdStyleFlag();
			pfeat->FillInBoolean(pcman->SymbolTable());
			pfeat->ErrorCheckContd();
			pfeat->CalculateDefault();
			pfeat->AssignInternalID(nInternalID); 
			pfeat->RecordDebugInfo();

			nInternalID += int(vnIDs.size());  // each alternate ID has its own internal ID
		}
	}

	if (m_vpfeat.size() > kMaxFeatures)
	{
		g_errorList.AddError(3153, NULL,
			"Number of features (",
			std::to_string(m_vpfeat.size()),
			") exceeds maximum of ",
			std::to_string(kMaxFeatures));
	}

	return true;
}